

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbcursor.cpp
# Opt level: O0

void __thiscall QFbCursor::updateMouseStatus(QFbCursor *this)

{
  long *plVar1;
  long *in_RDI;
  long in_FS_OFFSET;
  bool local_29;
  QRect local_18;
  QFbCursor *this_00;
  
  this_00 = *(QFbCursor **)(in_FS_OFFSET + 0x28);
  if (in_RDI[10] == 0) {
    local_29 = false;
  }
  else {
    local_29 = QFbCursorDeviceListener::hasMouse((QFbCursorDeviceListener *)0x11fbea);
  }
  *(bool *)(in_RDI + 2) = local_29;
  plVar1 = (long *)in_RDI[3];
  if ((*(byte *)(in_RDI + 2) & 1) == 0) {
    local_18 = (QRect)(**(code **)(*in_RDI + 0xb8))();
  }
  else {
    local_18 = getCurrentRect(this_00);
  }
  (**(code **)(*plVar1 + 0xd0))(plVar1,&local_18);
  if (*(QFbCursor **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFbCursor::updateMouseStatus()
{
    mVisible = mDeviceListener ? mDeviceListener->hasMouse() : false;
    mScreen->setDirty(mVisible ? getCurrentRect() : lastPainted());
}